

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::XMLNotationDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLNotationDecl *pXVar2;
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> e;
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> local_30;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    local_30.fMemoryManager = objToStore->fMemoryManager;
    local_30.super_XMLEnumerator<xercesc_4_0::XMLNotationDecl>._vptr_XMLEnumerator =
         (_func_int **)&PTR__XMLEnumerator_00413c28;
    local_30.fCurIndex = (XMLSize_t)(objToStore->fIdCounter != 0);
    local_30.fToEnum = objToStore;
    XSerializeEngine::operator<<(serEng,(uint)objToStore->fIdCounter);
    if (local_30.fCurIndex != 0) {
      do {
        if ((local_30.fToEnum)->fIdCounter < local_30.fCurIndex) {
          return;
        }
        pXVar2 = NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::nextElement(&local_30);
        (*(pXVar2->super_XSerializable)._vptr_XSerializable[3])(pXVar2,serEng);
      } while (local_30.fCurIndex != 0);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<XMLNotationDecl>* const objToStore
                                    , XSerializeEngine&                  serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<XMLNotationDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            XMLNotationDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }
}